

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

Status __thiscall
leveldb::BlockConstructor::FinishImpl(BlockConstructor *this,Options *options,KVMap *data)

{
  _Rb_tree_node_base *p_Var1;
  Block *pBVar2;
  long in_RCX;
  Slice SVar3;
  BlockBuilder builder;
  BlockContents local_c8;
  Slice local_a8;
  BlockBuilder local_98;
  
  pBVar2 = (Block *)options[1].comparator;
  if (pBVar2 != (Block *)0x0) {
    Block::~Block(pBVar2);
    operator_delete(pBVar2);
  }
  options[1].comparator = (Comparator *)0x0;
  BlockBuilder::BlockBuilder(&local_98,(Options *)data);
  p_Var1 = *(_Rb_tree_node_base **)(in_RCX + 0x18);
  if (p_Var1 != (_Rb_tree_node_base *)(in_RCX + 8)) {
    do {
      local_c8.data.data_ = *(char **)(p_Var1 + 1);
      local_c8.data.size_ = (size_t)p_Var1[1]._M_parent;
      local_a8.data_ = *(char **)(p_Var1 + 2);
      local_a8.size_ = (size_t)p_Var1[2]._M_parent;
      BlockBuilder::Add(&local_98,&local_c8.data,&local_a8);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)(in_RCX + 8));
  }
  SVar3 = BlockBuilder::Finish(&local_98);
  local_c8.data.data_ = &local_c8.cachable;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,SVar3.data_,SVar3.data_ + SVar3.size_);
  std::__cxx11::string::operator=((string *)&options->block_restart_interval,(string *)&local_c8);
  if ((bool *)local_c8.data.data_ != &local_c8.cachable) {
    operator_delete(local_c8.data.data_);
  }
  local_c8.data.data_ = *(char **)&options->block_restart_interval;
  local_c8.data.size_ = options->max_file_size;
  local_c8.cachable = false;
  local_c8.heap_allocated = false;
  pBVar2 = (Block *)operator_new(0x18);
  Block::Block(pBVar2,&local_c8);
  options[1].comparator = (Comparator *)pBVar2;
  (this->super_Constructor)._vptr_Constructor = (_func_int **)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.last_key_._M_dataplus._M_p != &local_98.last_key_.field_2) {
    operator_delete(local_98.last_key_._M_dataplus._M_p);
  }
  if (local_98.restarts_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.restarts_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.buffer_._M_dataplus._M_p != &local_98.buffer_.field_2) {
    operator_delete(local_98.buffer_._M_dataplus._M_p);
  }
  return (Status)(char *)this;
}

Assistant:

Status FinishImpl(const Options& options, const KVMap& data) override {
    delete block_;
    block_ = nullptr;
    BlockBuilder builder(&options);

    for (const auto& kvp : data) {
      builder.Add(kvp.first, kvp.second);
    }
    // Open the block
    data_ = builder.Finish().ToString();
    BlockContents contents;
    contents.data = data_;
    contents.cachable = false;
    contents.heap_allocated = false;
    block_ = new Block(contents);
    return Status::OK();
  }